

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> * __thiscall
tinyusdz::ascii::AsciiParser::ParsePrimMeta
          (optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
           *__return_storage_ptr__,AsciiParser *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  value_type *rhs;
  string local_ae0;
  allocator local_ab9;
  string local_ab8 [32];
  fmt local_a98 [32];
  ostringstream local_a78 [8];
  ostringstream ss_e_3;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_900;
  string local_8b8;
  ostringstream local_898 [8];
  ostringstream ss_e_2;
  undefined1 local_720 [8];
  value_type vardef;
  MetaVariable var_3;
  undefined1 local_610 [8];
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pv;
  undefined1 local_560 [8];
  MetaVariable var_2;
  string local_520;
  ostringstream local_500 [8];
  ostringstream ss_e_1;
  undefined1 local_388 [8];
  string content;
  string local_360;
  ostringstream local_340 [8];
  ostringstream ss_e;
  undefined1 local_1c0 [6];
  bool registered_meta;
  string varname;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_198;
  allocator local_151;
  string local_150;
  undefined1 local_130 [8];
  MetaVariable var_1;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_f0;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  MetaVariable var;
  StringData sdata;
  ListEditQual qual;
  AsciiParser *this_local;
  
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (bVar1) {
    sdata.line_col = 0;
    tinyusdz::value::StringData::StringData((StringData *)((long)&var._name.field_2 + 8));
    bVar1 = MaybeTripleQuotedString(this,(StringData *)((long)&var._name.field_2 + 8));
    if (bVar1) {
      MetaVariable::MetaVariable((MetaVariable *)local_88);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"comment",&local_a9);
      MetaVariable::set_value<tinyusdz::value::StringData>
                ((MetaVariable *)local_88,&local_a8,(StringData *)((long)&var._name.field_2 + 8));
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                (&local_f0,(ListEditQual *)&sdata.line_col,(MetaVariable *)local_88);
      nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
      optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                (__return_storage_ptr__,&local_f0);
      ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair(&local_f0);
      var_1._name.field_2._12_4_ = 1;
      MetaVariable::~MetaVariable((MetaVariable *)local_88);
    }
    else {
      bVar1 = MaybeString(this,(StringData *)((long)&var._name.field_2 + 8));
      if (bVar1) {
        MetaVariable::MetaVariable((MetaVariable *)local_130);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_150,"comment",&local_151);
        MetaVariable::set_value<tinyusdz::value::StringData>
                  ((MetaVariable *)local_130,&local_150,(StringData *)((long)&var._name.field_2 + 8)
                  );
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
        ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                  (&local_198,(ListEditQual *)&sdata.line_col,(MetaVariable *)local_130);
        nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
        ::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                  (__return_storage_ptr__,&local_198);
        ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair(&local_198);
        var_1._name.field_2._12_4_ = 1;
        MetaVariable::~MetaVariable((MetaVariable *)local_130);
      }
      else {
        var_1._name.field_2._12_4_ = 0;
      }
    }
    tinyusdz::value::StringData::~StringData((StringData *)((long)&var._name.field_2 + 8));
    if (var_1._name.field_2._12_4_ == 0) {
      bVar1 = MaybeListEditQual(this,(ListEditQual *)&sdata.line_col);
      if (bVar1) {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (bVar1) {
          ::std::__cxx11::string::string((string *)local_1c0);
          bVar1 = ReadIdentifier(this,(string *)local_1c0);
          if (bVar1) {
            bVar1 = IsRegisteredPrimMeta(this,(string *)local_1c0);
            bVar2 = Expect(this,'=');
            if (bVar2) {
              SkipWhitespace(this);
              if (bVar1) {
                GetPrimMetaDefinition
                          ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                           ((long)&var_3._name.field_2 + 8),this,(string *)local_1c0);
                nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                          ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_610,
                           (optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                           ((long)&var_3._name.field_2 + 8));
                nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                ~optional((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                          ((long)&var_3._name.field_2 + 8));
                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)local_610);
                if (bVar1) {
                  MetaVariable::MetaVariable((MetaVariable *)&vardef.post_parse_handler._M_invoker);
                  rhs = nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                        value((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_610);
                  VariableDef::VariableDef((VariableDef *)local_720,rhs);
                  bVar1 = ParseMetaValue(this,(VariableDef *)local_720,
                                         (MetaVariable *)&vardef.post_parse_handler._M_invoker);
                  if (bVar1) {
                    MetaVariable::set_name
                              ((MetaVariable *)&vardef.post_parse_handler._M_invoker,
                               (string *)local_1c0);
                    ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                              (&local_900,(ListEditQual *)&sdata.line_col,
                               (MetaVariable *)&vardef.post_parse_handler._M_invoker);
                    nonstd::optional_lite::
                    optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
                    optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                              (__return_storage_ptr__,&local_900);
                    ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair(&local_900);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_898);
                    poVar3 = ::std::operator<<((ostream *)local_898,"[error]");
                    poVar3 = ::std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                              );
                    poVar3 = ::std::operator<<(poVar3,":");
                    poVar3 = ::std::operator<<(poVar3,"ParsePrimMeta");
                    poVar3 = ::std::operator<<(poVar3,"():");
                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc4c);
                    ::std::operator<<(poVar3," ");
                    poVar3 = ::std::operator<<((ostream *)local_898,
                                               "Failed to parse Prim meta value.");
                    ::std::operator<<(poVar3,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_8b8);
                    ::std::__cxx11::string::~string((string *)&local_8b8);
                    ::std::__cxx11::ostringstream::~ostringstream(local_898);
                    nonstd::optional_lite::
                    optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                              (__return_storage_ptr__);
                  }
                  var_1._name.field_2._12_4_ = 1;
                  VariableDef::~VariableDef((VariableDef *)local_720);
                  MetaVariable::~MetaVariable((MetaVariable *)&vardef.post_parse_handler._M_invoker)
                  ;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_a78);
                  poVar3 = ::std::operator<<((ostream *)local_a78,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ParsePrimMeta");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc55);
                  ::std::operator<<(poVar3," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_ab8,
                             "[Internal error] Unsupported/unimplemented PrimSpec metadata {}",
                             &local_ab9);
                  fmt::format<std::__cxx11::string>
                            (local_a98,(string *)local_ab8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c0);
                  poVar3 = ::std::operator<<((ostream *)local_a78,(string *)local_a98);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)local_a98);
                  ::std::__cxx11::string::~string(local_ab8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_ae0);
                  ::std::__cxx11::string::~string((string *)&local_ae0);
                  ::std::__cxx11::ostringstream::~ostringstream(local_a78);
                  nonstd::optional_lite::
                  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                            (__return_storage_ptr__);
                  var_1._name.field_2._12_4_ = 1;
                }
                nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                ~optional((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_610);
              }
              else {
                ::std::__cxx11::string::string((string *)local_388);
                bVar1 = ReadUntilNewline(this,(string *)local_388);
                if (bVar1) {
                  MetaVariable::MetaVariable((MetaVariable *)local_560);
                  MetaVariable::set_value<std::__cxx11::string>
                            ((MetaVariable *)local_560,(string *)local_1c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
                  ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                            ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
                             ((long)&pv.contained + 0x60),(ListEditQual *)&sdata.line_col,
                             (MetaVariable *)local_560);
                  nonstd::optional_lite::
                  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
                  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                            (__return_storage_ptr__,
                             (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
                             ((long)&pv.contained + 0x60));
                  ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair
                            ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
                             ((long)&pv.contained + 0x60));
                  var_1._name.field_2._12_4_ = 1;
                  MetaVariable::~MetaVariable((MetaVariable *)local_560);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_500);
                  poVar3 = ::std::operator<<((ostream *)local_500,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ParsePrimMeta");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc3f);
                  ::std::operator<<(poVar3," ");
                  poVar3 = ::std::operator<<((ostream *)local_500,
                                             "Failed to parse unregistered Prim metadata.");
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_520);
                  ::std::__cxx11::string::~string((string *)&local_520);
                  ::std::__cxx11::ostringstream::~ostringstream(local_500);
                  nonstd::optional_lite::
                  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                            (__return_storage_ptr__);
                  var_1._name.field_2._12_4_ = 1;
                }
                ::std::__cxx11::string::~string((string *)local_388);
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_340);
              poVar3 = ::std::operator<<((ostream *)local_340,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParsePrimMeta");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xc35);
              ::std::operator<<(poVar3," ");
              poVar3 = ::std::operator<<((ostream *)local_340,
                                         "\'=\' expected in Prim Metadata line.");
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_360);
              ::std::__cxx11::string::~string((string *)&local_360);
              ::std::__cxx11::ostringstream::~ostringstream(local_340);
              nonstd::optional_lite::
              optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                        (__return_storage_ptr__);
              var_1._name.field_2._12_4_ = 1;
            }
          }
          else {
            nonstd::optional_lite::
            optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                      (__return_storage_ptr__);
            var_1._name.field_2._12_4_ = 1;
          }
          ::std::__cxx11::string::~string((string *)local_1c0);
        }
        else {
          nonstd::optional_lite::
          optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::optional
                    (__return_storage_ptr__);
        }
      }
      else {
        nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
        ::optional(__return_storage_ptr__);
      }
    }
  }
  else {
    nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::pair<ListEditQual, MetaVariable>>
AsciiParser::ParsePrimMeta() {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};

  // May be string only(varname is "comment")
  // For some reason, string-only data is just stored in `MetaVariable` and
  // reconstructed in ReconstructPrimMeta in usda-reader.cc later
  //
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      MetaVariable var;
      // empty name
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);

    } else if (MaybeString(&sdata)) {
      MetaVariable var;
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);
    }
  }

  if (!MaybeListEditQual(&qual)) {
    return nonstd::nullopt;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return nonstd::nullopt;
  }

  DCOUT("Identifier = " << varname);

  bool registered_meta = IsRegisteredPrimMeta(varname);

  if (!Expect('=')) {
    PUSH_ERROR("'=' expected in Prim Metadata line.");
    return nonstd::nullopt;
  }
  SkipWhitespace();

  if (!registered_meta) {
    // parse as string until newline

    std::string content;
    if (!ReadUntilNewline(&content)) {
      PUSH_ERROR("Failed to parse unregistered Prim metadata.");
      return nonstd::nullopt;
    }

    MetaVariable var;
    var.set_value(varname, content);

    return std::make_pair(qual, var);
  } else {
    if (auto pv = GetPrimMetaDefinition(varname)) {
      MetaVariable var;
      const auto vardef = pv.value();
      if (!ParseMetaValue(vardef, &var)) {
        PUSH_ERROR("Failed to parse Prim meta value.");
        return nonstd::nullopt;
      }
      var.set_name(varname);

      return std::make_pair(qual, var);
    } else {
      PUSH_ERROR(fmt::format(
          "[Internal error] Unsupported/unimplemented PrimSpec metadata {}",
          varname));
      return nonstd::nullopt;
    }
  }
}